

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  undefined4 *puVar1;
  Bit *this;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 in_R8;
  string_t sVar4;
  string_t sVar5;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  puVar1 = *(undefined4 **)(result + 0x20);
  if (((*(byte **)(left + 0x28) == (byte *)0x0) || ((**(byte **)(left + 0x28) & 1) != 0)) &&
     ((*(byte **)(right + 0x28) == (byte *)0x0 || ((**(byte **)(right + 0x28) & 1) != 0)))) {
    this = (Bit *)**(undefined8 **)(left + 0x20);
    uVar2 = **(undefined8 **)(right + 0x20);
    uVar3 = 0;
    if ((uint)this <= (uint)uVar2) {
      sVar4.value.pointer.ptr = (char *)uVar2;
      sVar4.value._0_8_ = (*(undefined8 **)(left + 0x20))[1];
      sVar5.value.pointer.ptr = (char *)in_R8;
      sVar5.value._0_8_ = (*(undefined8 **)(right + 0x20))[1];
      uVar3 = duckdb::Bit::BitPosition(this,sVar4,sVar5);
    }
    *puVar1 = uVar3;
    return;
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}